

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

bool ExecuteProblemSpace(shared_ptr<celero::ExperimentResult> *r)

{
  bool bVar1;
  element_type *peVar2;
  Experiment *pEVar3;
  uint64_t uVar4;
  element_type *peVar5;
  ostream *poVar6;
  element_type *this;
  string local_f8;
  shared_ptr<celero::Benchmark> local_d8;
  string local_c8;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_a8;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_98;
  uint64_t local_88;
  uint64_t i;
  shared_ptr<celero::TestFixture> local_70;
  undefined1 local_60 [8];
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_48 [2];
  undefined1 local_28 [8];
  anon_class_16_1_54a39812 testRunner;
  shared_ptr<celero::ExperimentResult> *r_local;
  
  testRunner.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)r;
  std::shared_ptr<celero::ExperimentResult>::shared_ptr
            ((shared_ptr<celero::ExperimentResult> *)local_28,r);
  peVar2 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)r);
  pEVar3 = celero::ExperimentResult::getExperiment(peVar2);
  uVar4 = celero::Experiment::getSamples(pEVar3);
  if (uVar4 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Celero Test \"");
    peVar2 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)r);
    celero::ExperimentResult::getExperiment(peVar2);
    celero::Experiment::getBenchmark((Experiment *)&local_d8);
    this = std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_d8);
    celero::Benchmark::getName_abi_cxx11_(&local_c8,this);
    poVar6 = std::operator<<(poVar6,(string *)&local_c8);
    poVar6 = std::operator<<(poVar6,"::");
    peVar2 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)r);
    pEVar3 = celero::ExperimentResult::getExperiment(peVar2);
    celero::Experiment::getName_abi_cxx11_(&local_f8,pEVar3);
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6,"\" must have at least 1 sample.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::shared_ptr<celero::Benchmark>::~shared_ptr(&local_d8);
    r_local._7_1_ = 0;
    udmCollector.
    super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  else {
    std::shared_ptr<celero::UserDefinedMeasurementCollector>::shared_ptr(local_48,(nullptr_t)0x0);
    bVar1 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()
                      ((anon_class_16_1_54a39812 *)local_28,false,local_48);
    std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr(local_48);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)r);
      celero::ExperimentResult::getExperiment(peVar2);
      celero::Experiment::getFactory((Experiment *)&i);
      peVar5 = std::__shared_ptr_access<celero::Factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<celero::Factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&i);
      (**(code **)(*(long *)peVar5 + 0x10))(&local_70);
      std::make_shared<celero::UserDefinedMeasurementCollector,std::shared_ptr<celero::TestFixture>>
                ((shared_ptr<celero::TestFixture> *)local_60);
      std::shared_ptr<celero::TestFixture>::~shared_ptr(&local_70);
      std::shared_ptr<celero::Factory>::~shared_ptr((shared_ptr<celero::Factory> *)&i);
      peVar2 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)r);
      pEVar3 = celero::ExperimentResult::getExperiment(peVar2);
      for (local_88 = celero::Experiment::getSamples(pEVar3); local_88 != 0; local_88 = local_88 - 1
          ) {
        std::shared_ptr<celero::UserDefinedMeasurementCollector>::shared_ptr
                  (&local_98,(shared_ptr<celero::UserDefinedMeasurementCollector> *)local_60);
        bVar1 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()
                          ((anon_class_16_1_54a39812 *)local_28,true,&local_98);
        std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr(&local_98);
        if (!bVar1) {
          peVar2 = std::
                   __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)r);
          celero::ExperimentResult::setFailure(peVar2,true);
          r_local._7_1_ = 0;
          udmCollector.
          super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 1;
          goto LAB_001a53d5;
        }
      }
      peVar2 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)r);
      std::shared_ptr<celero::UserDefinedMeasurementCollector>::shared_ptr
                (&local_a8,(shared_ptr<celero::UserDefinedMeasurementCollector> *)local_60);
      celero::ExperimentResult::setUserDefinedMeasurements(peVar2,&local_a8);
      std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr(&local_a8);
      peVar2 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)r);
      celero::ExperimentResult::setComplete(peVar2,true);
      udmCollector.
      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
LAB_001a53d5:
      std::shared_ptr<celero::UserDefinedMeasurementCollector>::~shared_ptr
                ((shared_ptr<celero::UserDefinedMeasurementCollector> *)local_60);
      if (udmCollector.
          super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ == 0) {
        r_local._7_1_ = 1;
        udmCollector.
        super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 1;
      }
    }
    else {
      peVar2 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)r);
      celero::ExperimentResult::setFailure(peVar2,true);
      r_local._7_1_ = 0;
      udmCollector.
      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 1;
    }
  }
  ExecuteProblemSpace(std::shared_ptr<celero::ExperimentResult>)::$_0::~__0((__0 *)local_28);
  return (bool)(r_local._7_1_ & 1);
}

Assistant:

bool ExecuteProblemSpace(std::shared_ptr<celero::ExperimentResult> r)
{
	// Define a small internal function object to use to uniformly execute the tests.
	auto testRunner = [r](const bool record, std::shared_ptr<UserDefinedMeasurementCollector> udmCollector)
	{
		auto test = r->getExperiment()->getFactory()->Create();

		const auto runResult = RunAndCatchExc(*test, r->getExperiment()->getThreads(), r->getProblemSpaceIterations(), r->getProblemSpace());

		if(runResult.first == false)
		{
			// something bad happened
			return false;
		}

		const auto testTime = runResult.second;

		// Save test results
		if(record == true)
		{
			r->addRunTimeSample(testTime);
			r->addMemorySample(celero::GetRAMVirtualUsedByCurrentProcess());
			r->getExperiment()->incrementTotalRunTime(testTime);

			if(udmCollector != nullptr)
			{
				udmCollector->collect(test);
			}
		}

		return true;
	};

	if(r->getExperiment()->getSamples() > 0)
	{
		// make a first pass to maybe cache instructions/data or other kinds of fist-run-only costs
		if(testRunner(false, nullptr) == false)
		{
			r->setFailure(true);
			return false;
		}

		auto udmCollector = std::make_shared<UserDefinedMeasurementCollector>(r->getExperiment()->getFactory()->Create());

		for(auto i = r->getExperiment()->getSamples(); i > 0; --i)
		{
			if(testRunner(true, udmCollector) == false)
			{
				r->setFailure(true);
				return false;
			}
		}

		r->setUserDefinedMeasurements(udmCollector);
		r->setComplete(true);
	}
	else
	{
		std::cerr << "ERROR: Celero Test \"" << r->getExperiment()->getBenchmark()->getName() << "::" << r->getExperiment()->getName()
				  << "\" must have at least 1 sample." << std::endl;
		return false;
	}

	return true;
}